

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

Test * GraphTestDyndepLoadOutputWithMultipleRules2::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x230);
  GraphTestDyndepLoadOutputWithMultipleRules2((GraphTestDyndepLoadOutputWithMultipleRules2 *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, DyndepLoadOutputWithMultipleRules2) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out1: r in1 || dd1\n"
"  dyndep = dd1\n"
"build out2: r in2 || dd2\n"
"  dyndep = dd2\n"
  );
  fs_.Create("dd1",
"ninja_dyndep_version = 1\n"
"build out1 | out-twice.imp: dyndep\n"
  );
  fs_.Create("dd2",
"ninja_dyndep_version = 1\n"
"build out2 | out-twice.imp: dyndep\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd1")->dyndep_pending());
  EXPECT_TRUE(scan_.LoadDyndeps(GetNode("dd1"), &err));
  EXPECT_EQ("", err);
  ASSERT_TRUE(GetNode("dd2")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd2"), &err));
  EXPECT_EQ("multiple rules generate out-twice.imp", err);
}